

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

uLong deflateBound(z_streamp strm,uLong sourceLen)

{
  Bytef BVar1;
  uint uVar2;
  internal_state *piVar3;
  gz_headerp pgVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  uLong uVar8;
  Bytef *pBVar9;
  ulong uVar10;
  ulong uStack_30;
  
  lVar7 = (sourceLen + 7 >> 3) + sourceLen;
  uVar10 = sourceLen + 0x3f >> 6;
  iVar5 = deflateStateCheck(strm);
  if (iVar5 == 0) {
    piVar3 = strm->state;
    uVar2 = piVar3->wrap;
    uStack_30 = (ulong)uVar2;
    if ((ulong)uVar2 != 0) {
      if (uVar2 == 2) {
        pgVar4 = piVar3->gzhead;
        if (pgVar4 == (gz_headerp)0x0) {
          uStack_30 = 0x12;
        }
        else {
          if (pgVar4->extra == (Bytef *)0x0) {
            uVar6 = 0x12;
          }
          else {
            uVar6 = (ulong)(pgVar4->extra_len + 2) + 0x12;
          }
          pBVar9 = pgVar4->name;
          if (pBVar9 != (Bytef *)0x0) {
            do {
              uVar6 = uVar6 + 1;
              BVar1 = *pBVar9;
              pBVar9 = pBVar9 + 1;
            } while (BVar1 != '\0');
          }
          pBVar9 = pgVar4->comment;
          if (pBVar9 != (Bytef *)0x0) {
            do {
              uVar6 = uVar6 + 1;
              BVar1 = *pBVar9;
              pBVar9 = pBVar9 + 1;
            } while (BVar1 != '\0');
          }
          uStack_30 = uVar6 + 2;
          if (pgVar4->hcrc == 0) {
            uStack_30 = uVar6;
          }
        }
      }
      else if (uVar2 == 1) {
        uStack_30 = (ulong)(piVar3->strstart != 0) * 4 + 6;
      }
      else {
        uStack_30 = 6;
      }
    }
    if ((piVar3->w_bits == 0xf) && (piVar3->hash_bits == 0xf)) {
      uVar8 = sourceLen + 7 + (sourceLen >> 0xc) + (sourceLen >> 0x19) + (sourceLen >> 0xe) +
              uStack_30;
    }
    else {
      uVar8 = lVar7 + uVar10 + 5 + uStack_30;
    }
  }
  else {
    uVar8 = lVar7 + uVar10 + 0xb;
  }
  return uVar8;
}

Assistant:

uLong ZEXPORT deflateBound(strm, sourceLen)
    z_streamp strm;
    uLong sourceLen;
{
    deflate_state *s;
    uLong complen, wraplen;

    /* conservative upper bound for compressed data */
    complen = sourceLen +
              ((sourceLen + 7) >> 3) + ((sourceLen + 63) >> 6) + 5;

    /* if can't get parameters, return conservative bound plus zlib wrapper */
    if (deflateStateCheck(strm))
        return complen + 6;

    /* compute wrapper length */
    s = strm->state;
    switch (s->wrap) {
    case 0:                                 /* raw deflate */
        wraplen = 0;
        break;
    case 1:                                 /* zlib wrapper */
        wraplen = 6 + (s->strstart ? 4 : 0);
        break;
#ifdef GZIP
    case 2:                                 /* gzip wrapper */
        wraplen = 18;
        if (s->gzhead != Z_NULL) {          /* user-supplied gzip header */
            Bytef *str;
            if (s->gzhead->extra != Z_NULL)
                wraplen += 2 + s->gzhead->extra_len;
            str = s->gzhead->name;
            if (str != Z_NULL)
                do {
                    wraplen++;
                } while (*str++);
            str = s->gzhead->comment;
            if (str != Z_NULL)
                do {
                    wraplen++;
                } while (*str++);
            if (s->gzhead->hcrc)
                wraplen += 2;
        }
        break;
#endif
    default:                                /* for compiler happiness */
        wraplen = 6;
    }

    /* if not default parameters, return conservative bound */
    if (s->w_bits != 15 || s->hash_bits != 8 + 7)
        return complen + wraplen;

    /* default settings: return tight bound for that case */
    return sourceLen + (sourceLen >> 12) + (sourceLen >> 14) +
           (sourceLen >> 25) + 13 - 6 + wraplen;
}